

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.cxx
# Opt level: O0

void __thiscall ViewTest::iteratorAccessTest<true>(ViewTest *this)

{
  allocator<int> *paVar1;
  undefined1 *puVar2;
  reference pvVar3;
  iterator iVar4;
  iterator iVar5;
  reference piVar6;
  Iterator<int,_true,_std::allocator<unsigned_long>_> *pIVar7;
  reference piVar8;
  reverse_iterator<andres::Iterator<int,_true,_std::allocator<unsigned_long>_>_> *prVar9;
  bool local_9f1;
  iterator local_9f0;
  bool local_9be;
  bool local_9bd;
  int local_9bc;
  undefined1 local_9b8 [4];
  int i_8;
  undefined1 local_988 [8];
  const_iterator it_8;
  undefined1 local_940 [8];
  View<int,_true,_std::allocator<unsigned_long>_> v_8;
  undefined1 local_8f8 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> shape_8;
  reverse_iterator local_8d8;
  bool local_8a6;
  bool local_8a5;
  int local_8a4;
  undefined1 local_8a0 [4];
  int i_7;
  undefined1 local_870 [8];
  reverse_iterator it_7;
  undefined1 local_828 [8];
  View<int,_true,_std::allocator<unsigned_long>_> v_7;
  undefined1 local_7e0 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> shape_7;
  iterator local_7c0;
  bool local_78e;
  bool local_78d;
  int local_78c;
  undefined1 local_788 [4];
  int i_6;
  undefined1 local_758 [8];
  iterator it_6;
  undefined1 local_710 [8];
  View<int,_true,_std::allocator<unsigned_long>_> v_6;
  undefined1 local_6c8 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> shape_6;
  iterator local_6a8;
  bool local_676;
  bool local_675;
  int local_674;
  undefined1 local_670 [4];
  int i_5;
  undefined1 local_640 [8];
  const_iterator it_5;
  undefined1 local_5f8 [8];
  View<int,_true,_std::allocator<unsigned_long>_> v_5;
  undefined1 local_5b0 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> shape_5;
  reverse_iterator local_590;
  bool local_55e;
  bool local_55d;
  int local_55c;
  undefined1 local_558 [4];
  int i_4;
  undefined1 local_528 [8];
  reverse_iterator it_4;
  undefined1 local_4e0 [8];
  View<int,_true,_std::allocator<unsigned_long>_> v_4;
  undefined1 local_498 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> shape_4;
  iterator local_478;
  bool local_446;
  bool local_445;
  int local_444;
  undefined1 local_440 [4];
  int i_3;
  undefined1 local_410 [8];
  iterator it_3;
  undefined1 local_3c8 [8];
  View<int,_true,_std::allocator<unsigned_long>_> v_3;
  undefined1 local_380 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> shape_3;
  iterator local_360;
  bool local_32e;
  bool local_32d;
  int local_32c;
  undefined1 local_328 [4];
  int i_2;
  undefined1 local_2f8 [8];
  const_iterator it_2;
  undefined1 local_2b0 [8];
  View<int,_true,_std::allocator<unsigned_long>_> v_2;
  undefined1 local_268 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> shape_2;
  reverse_iterator local_248;
  bool local_216;
  bool local_215;
  int local_214;
  undefined1 local_210 [4];
  int i_1;
  undefined1 local_1e0 [8];
  reverse_iterator it_1;
  undefined1 local_198 [8];
  View<int,_true,_std::allocator<unsigned_long>_> v_1;
  undefined1 local_150 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> shape_1;
  iterator local_130;
  bool local_fe;
  bool local_fd;
  int local_fc;
  undefined1 local_f8 [4];
  int i;
  undefined1 local_c8 [8];
  iterator it;
  undefined1 local_80 [8];
  View<int,_true,_std::allocator<unsigned_long>_> v;
  allocator<unsigned_long> local_29;
  undefined1 local_28 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> shape;
  ViewTest *this_local;
  
  shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)this;
  std::allocator<unsigned_long>::allocator(&local_29);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_28,1,&local_29);
  std::allocator<unsigned_long>::~allocator(&local_29);
  pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_28,0);
  *pvVar3 = 0x18;
  iVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_28);
  iVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_28);
  paVar1 = (allocator<int> *)
           ((long)&it.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<int>::allocator(paVar1);
  andres::View<int,true,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,true,std::allocator<unsigned_long>> *)local_80,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar4._M_current,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar5._M_current,this->data_,&andres::defaultOrder,&andres::defaultOrder,paVar1);
  std::allocator<int>::~allocator
            ((allocator<int> *)
             ((long)&it.coordinates_.
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_c8);
  andres::View<int,_true,_std::allocator<unsigned_long>_>::begin
            ((iterator *)local_f8,(View<int,_true,_std::allocator<unsigned_long>_> *)local_80);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator=
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_c8,
             (Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_f8);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::~Iterator
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_f8);
  for (local_fc = 0; local_fc < 0x18; local_fc = local_fc + 1) {
    piVar6 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator*
                       ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_c8);
    local_fd = *piVar6 == this->data_[local_fc];
    test(&local_fd);
    andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator++
              ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_c8);
  }
  andres::View<int,_true,_std::allocator<unsigned_long>_>::end
            (&local_130,(View<int,_true,_std::allocator<unsigned_long>_> *)local_80);
  local_fe = andres::Iterator<int,true,std::allocator<unsigned_long>>::operator==
                       ((Iterator<int,true,std::allocator<unsigned_long>> *)local_c8,&local_130);
  test(&local_fe);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::~Iterator(&local_130);
  pIVar7 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator--
                     ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_c8);
  piVar6 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator*(pIVar7);
  shape_1.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._7_1_ = *piVar6 == 0x17;
  test((bool *)((long)&shape_1.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::~Iterator
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_c8);
  andres::View<int,_true,_std::allocator<unsigned_long>_>::~View
            ((View<int,_true,_std::allocator<unsigned_long>_> *)local_80);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_28);
  puVar2 = &v_1.geometry_.field_0x37;
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)puVar2);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_150,1,
             (allocator_type *)puVar2);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)&v_1.geometry_.field_0x37);
  pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_150,0);
  *pvVar3 = 0x18;
  iVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_150);
  iVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_150);
  paVar1 = (allocator<int> *)
           ((long)&it_1.current.coordinates_.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<int>::allocator(paVar1);
  andres::View<int,true,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,true,std::allocator<unsigned_long>> *)local_198,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar4._M_current,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar5._M_current,this->data_,&andres::defaultOrder,&andres::defaultOrder,paVar1);
  std::allocator<int>::~allocator
            ((allocator<int> *)
             ((long)&it_1.current.coordinates_.
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  std::reverse_iterator<andres::Iterator<int,_true,_std::allocator<unsigned_long>_>_>::
  reverse_iterator((reverse_iterator<andres::Iterator<int,_true,_std::allocator<unsigned_long>_>_> *
                   )local_1e0);
  andres::View<int,_true,_std::allocator<unsigned_long>_>::rbegin
            ((reverse_iterator *)local_210,
             (View<int,_true,_std::allocator<unsigned_long>_> *)local_198);
  std::reverse_iterator<andres::Iterator<int,_true,_std::allocator<unsigned_long>_>_>::operator=
            ((reverse_iterator<andres::Iterator<int,_true,_std::allocator<unsigned_long>_>_> *)
             local_1e0,
             (reverse_iterator<andres::Iterator<int,_true,_std::allocator<unsigned_long>_>_> *)
             local_210);
  std::reverse_iterator<andres::Iterator<int,_true,_std::allocator<unsigned_long>_>_>::
  ~reverse_iterator((reverse_iterator<andres::Iterator<int,_true,_std::allocator<unsigned_long>_>_>
                     *)local_210);
  for (local_214 = 0x17; -1 < local_214; local_214 = local_214 + -1) {
    piVar8 = std::reverse_iterator<andres::Iterator<int,_true,_std::allocator<unsigned_long>_>_>::
             operator*((reverse_iterator<andres::Iterator<int,_true,_std::allocator<unsigned_long>_>_>
                        *)local_1e0);
    local_215 = *piVar8 == this->data_[local_214];
    test(&local_215);
    std::reverse_iterator<andres::Iterator<int,_true,_std::allocator<unsigned_long>_>_>::operator++
              ((reverse_iterator<andres::Iterator<int,_true,_std::allocator<unsigned_long>_>_> *)
               local_1e0);
  }
  andres::View<int,_true,_std::allocator<unsigned_long>_>::rend
            (&local_248,(View<int,_true,_std::allocator<unsigned_long>_> *)local_198);
  local_216 = std::operator==((reverse_iterator<andres::Iterator<int,_true,_std::allocator<unsigned_long>_>_>
                               *)local_1e0,&local_248);
  test(&local_216);
  std::reverse_iterator<andres::Iterator<int,_true,_std::allocator<unsigned_long>_>_>::
  ~reverse_iterator(&local_248);
  prVar9 = std::reverse_iterator<andres::Iterator<int,_true,_std::allocator<unsigned_long>_>_>::
           operator--((reverse_iterator<andres::Iterator<int,_true,_std::allocator<unsigned_long>_>_>
                       *)local_1e0);
  piVar8 = std::reverse_iterator<andres::Iterator<int,_true,_std::allocator<unsigned_long>_>_>::
           operator*(prVar9);
  shape_2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._7_1_ = *piVar8 == 0;
  test((bool *)((long)&shape_2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  std::reverse_iterator<andres::Iterator<int,_true,_std::allocator<unsigned_long>_>_>::
  ~reverse_iterator((reverse_iterator<andres::Iterator<int,_true,_std::allocator<unsigned_long>_>_>
                     *)local_1e0);
  andres::View<int,_true,_std::allocator<unsigned_long>_>::~View
            ((View<int,_true,_std::allocator<unsigned_long>_> *)local_198);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_150);
  puVar2 = &v_2.geometry_.field_0x37;
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)puVar2);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_268,1,
             (allocator_type *)puVar2);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)&v_2.geometry_.field_0x37);
  pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_268,0);
  *pvVar3 = 0x18;
  iVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_268);
  iVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_268);
  paVar1 = (allocator<int> *)
           ((long)&it_2.coordinates_.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<int>::allocator(paVar1);
  andres::View<int,true,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,true,std::allocator<unsigned_long>> *)local_2b0,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar4._M_current,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar5._M_current,this->data_,&andres::defaultOrder,&andres::defaultOrder,paVar1);
  std::allocator<int>::~allocator
            ((allocator<int> *)
             ((long)&it_2.coordinates_.
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_2f8);
  andres::View<int,_true,_std::allocator<unsigned_long>_>::begin
            ((iterator *)local_328,(View<int,_true,_std::allocator<unsigned_long>_> *)local_2b0);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator=
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_2f8,
             (Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_328);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::~Iterator
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_328);
  for (local_32c = 0; local_32c < 0x18; local_32c = local_32c + 1) {
    piVar6 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator*
                       ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_2f8);
    local_32d = *piVar6 == this->data_[local_32c];
    test(&local_32d);
    andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator++
              ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_2f8);
  }
  andres::View<int,_true,_std::allocator<unsigned_long>_>::end
            (&local_360,(View<int,_true,_std::allocator<unsigned_long>_> *)local_2b0);
  local_32e = andres::Iterator<int,true,std::allocator<unsigned_long>>::operator==
                        ((Iterator<int,true,std::allocator<unsigned_long>> *)local_2f8,&local_360);
  test(&local_32e);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::~Iterator(&local_360);
  pIVar7 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator--
                     ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_2f8);
  piVar6 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator*(pIVar7);
  shape_3.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._7_1_ = *piVar6 == 0x17;
  test((bool *)((long)&shape_3.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::~Iterator
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_2f8);
  andres::View<int,_true,_std::allocator<unsigned_long>_>::~View
            ((View<int,_true,_std::allocator<unsigned_long>_> *)local_2b0);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_268);
  puVar2 = &v_3.geometry_.field_0x37;
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)puVar2);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_380,2,
             (allocator_type *)puVar2);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)&v_3.geometry_.field_0x37);
  pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_380,0);
  *pvVar3 = 6;
  pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_380,1);
  *pvVar3 = 4;
  iVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_380);
  iVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_380);
  paVar1 = (allocator<int> *)
           ((long)&it_3.coordinates_.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<int>::allocator(paVar1);
  andres::View<int,true,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,true,std::allocator<unsigned_long>> *)local_3c8,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar4._M_current,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar5._M_current,this->data_,&andres::defaultOrder,&andres::defaultOrder,paVar1);
  std::allocator<int>::~allocator
            ((allocator<int> *)
             ((long)&it_3.coordinates_.
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_410);
  andres::View<int,_true,_std::allocator<unsigned_long>_>::begin
            ((iterator *)local_440,(View<int,_true,_std::allocator<unsigned_long>_> *)local_3c8);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator=
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_410,
             (Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_440);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::~Iterator
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_440);
  for (local_444 = 0; local_444 < 0x18; local_444 = local_444 + 1) {
    piVar6 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator*
                       ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_410);
    local_445 = *piVar6 == this->data_[local_444];
    test(&local_445);
    andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator++
              ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_410);
  }
  andres::View<int,_true,_std::allocator<unsigned_long>_>::end
            (&local_478,(View<int,_true,_std::allocator<unsigned_long>_> *)local_3c8);
  local_446 = andres::Iterator<int,true,std::allocator<unsigned_long>>::operator==
                        ((Iterator<int,true,std::allocator<unsigned_long>> *)local_410,&local_478);
  test(&local_446);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::~Iterator(&local_478);
  pIVar7 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator--
                     ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_410);
  piVar6 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator*(pIVar7);
  shape_4.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._7_1_ = *piVar6 == 0x17;
  test((bool *)((long)&shape_4.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::~Iterator
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_410);
  andres::View<int,_true,_std::allocator<unsigned_long>_>::~View
            ((View<int,_true,_std::allocator<unsigned_long>_> *)local_3c8);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_380);
  puVar2 = &v_4.geometry_.field_0x37;
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)puVar2);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_498,2,
             (allocator_type *)puVar2);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)&v_4.geometry_.field_0x37);
  pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_498,0);
  *pvVar3 = 6;
  pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_498,1);
  *pvVar3 = 4;
  iVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_498);
  iVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_498);
  paVar1 = (allocator<int> *)
           ((long)&it_4.current.coordinates_.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<int>::allocator(paVar1);
  andres::View<int,true,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,true,std::allocator<unsigned_long>> *)local_4e0,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar4._M_current,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar5._M_current,this->data_,&andres::defaultOrder,&andres::defaultOrder,paVar1);
  std::allocator<int>::~allocator
            ((allocator<int> *)
             ((long)&it_4.current.coordinates_.
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  std::reverse_iterator<andres::Iterator<int,_true,_std::allocator<unsigned_long>_>_>::
  reverse_iterator((reverse_iterator<andres::Iterator<int,_true,_std::allocator<unsigned_long>_>_> *
                   )local_528);
  andres::View<int,_true,_std::allocator<unsigned_long>_>::rbegin
            ((reverse_iterator *)local_558,
             (View<int,_true,_std::allocator<unsigned_long>_> *)local_4e0);
  std::reverse_iterator<andres::Iterator<int,_true,_std::allocator<unsigned_long>_>_>::operator=
            ((reverse_iterator<andres::Iterator<int,_true,_std::allocator<unsigned_long>_>_> *)
             local_528,
             (reverse_iterator<andres::Iterator<int,_true,_std::allocator<unsigned_long>_>_> *)
             local_558);
  std::reverse_iterator<andres::Iterator<int,_true,_std::allocator<unsigned_long>_>_>::
  ~reverse_iterator((reverse_iterator<andres::Iterator<int,_true,_std::allocator<unsigned_long>_>_>
                     *)local_558);
  for (local_55c = 0x17; -1 < local_55c; local_55c = local_55c + -1) {
    piVar8 = std::reverse_iterator<andres::Iterator<int,_true,_std::allocator<unsigned_long>_>_>::
             operator*((reverse_iterator<andres::Iterator<int,_true,_std::allocator<unsigned_long>_>_>
                        *)local_528);
    local_55d = *piVar8 == this->data_[local_55c];
    test(&local_55d);
    std::reverse_iterator<andres::Iterator<int,_true,_std::allocator<unsigned_long>_>_>::operator++
              ((reverse_iterator<andres::Iterator<int,_true,_std::allocator<unsigned_long>_>_> *)
               local_528);
  }
  andres::View<int,_true,_std::allocator<unsigned_long>_>::rend
            (&local_590,(View<int,_true,_std::allocator<unsigned_long>_> *)local_4e0);
  local_55e = std::operator==((reverse_iterator<andres::Iterator<int,_true,_std::allocator<unsigned_long>_>_>
                               *)local_528,&local_590);
  test(&local_55e);
  std::reverse_iterator<andres::Iterator<int,_true,_std::allocator<unsigned_long>_>_>::
  ~reverse_iterator(&local_590);
  prVar9 = std::reverse_iterator<andres::Iterator<int,_true,_std::allocator<unsigned_long>_>_>::
           operator--((reverse_iterator<andres::Iterator<int,_true,_std::allocator<unsigned_long>_>_>
                       *)local_528);
  piVar8 = std::reverse_iterator<andres::Iterator<int,_true,_std::allocator<unsigned_long>_>_>::
           operator*(prVar9);
  shape_5.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._7_1_ = *piVar8 == 0;
  test((bool *)((long)&shape_5.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  std::reverse_iterator<andres::Iterator<int,_true,_std::allocator<unsigned_long>_>_>::
  ~reverse_iterator((reverse_iterator<andres::Iterator<int,_true,_std::allocator<unsigned_long>_>_>
                     *)local_528);
  andres::View<int,_true,_std::allocator<unsigned_long>_>::~View
            ((View<int,_true,_std::allocator<unsigned_long>_> *)local_4e0);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_498);
  puVar2 = &v_5.geometry_.field_0x37;
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)puVar2);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_5b0,2,
             (allocator_type *)puVar2);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)&v_5.geometry_.field_0x37);
  pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_5b0,0);
  *pvVar3 = 6;
  pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_5b0,1);
  *pvVar3 = 4;
  iVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_5b0);
  iVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_5b0);
  paVar1 = (allocator<int> *)
           ((long)&it_5.coordinates_.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<int>::allocator(paVar1);
  andres::View<int,true,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,true,std::allocator<unsigned_long>> *)local_5f8,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar4._M_current,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar5._M_current,this->data_,&andres::defaultOrder,&andres::defaultOrder,paVar1);
  std::allocator<int>::~allocator
            ((allocator<int> *)
             ((long)&it_5.coordinates_.
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_640);
  andres::View<int,_true,_std::allocator<unsigned_long>_>::begin
            ((iterator *)local_670,(View<int,_true,_std::allocator<unsigned_long>_> *)local_5f8);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator=
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_640,
             (Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_670);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::~Iterator
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_670);
  for (local_674 = 0; local_674 < 0x18; local_674 = local_674 + 1) {
    piVar6 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator*
                       ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_640);
    local_675 = *piVar6 == this->data_[local_674];
    test(&local_675);
    andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator++
              ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_640);
  }
  andres::View<int,_true,_std::allocator<unsigned_long>_>::end
            (&local_6a8,(View<int,_true,_std::allocator<unsigned_long>_> *)local_5f8);
  local_676 = andres::Iterator<int,true,std::allocator<unsigned_long>>::operator==
                        ((Iterator<int,true,std::allocator<unsigned_long>> *)local_640,&local_6a8);
  test(&local_676);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::~Iterator(&local_6a8);
  pIVar7 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator--
                     ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_640);
  piVar6 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator*(pIVar7);
  shape_6.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._7_1_ = *piVar6 == 0x17;
  test((bool *)((long)&shape_6.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::~Iterator
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_640);
  andres::View<int,_true,_std::allocator<unsigned_long>_>::~View
            ((View<int,_true,_std::allocator<unsigned_long>_> *)local_5f8);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_5b0);
  puVar2 = &v_6.geometry_.field_0x37;
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)puVar2);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_6c8,3,
             (allocator_type *)puVar2);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)&v_6.geometry_.field_0x37);
  pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_6c8,0);
  *pvVar3 = 3;
  pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_6c8,1);
  *pvVar3 = 4;
  pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_6c8,2);
  *pvVar3 = 2;
  iVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_6c8);
  iVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_6c8);
  paVar1 = (allocator<int> *)
           ((long)&it_6.coordinates_.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<int>::allocator(paVar1);
  andres::View<int,true,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,true,std::allocator<unsigned_long>> *)local_710,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar4._M_current,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar5._M_current,this->data_,&andres::defaultOrder,&andres::defaultOrder,paVar1);
  std::allocator<int>::~allocator
            ((allocator<int> *)
             ((long)&it_6.coordinates_.
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_758);
  andres::View<int,_true,_std::allocator<unsigned_long>_>::begin
            ((iterator *)local_788,(View<int,_true,_std::allocator<unsigned_long>_> *)local_710);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator=
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_758,
             (Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_788);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::~Iterator
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_788);
  for (local_78c = 0; local_78c < 0x18; local_78c = local_78c + 1) {
    piVar6 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator*
                       ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_758);
    local_78d = *piVar6 == this->data_[local_78c];
    test(&local_78d);
    andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator++
              ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_758);
  }
  andres::View<int,_true,_std::allocator<unsigned_long>_>::end
            (&local_7c0,(View<int,_true,_std::allocator<unsigned_long>_> *)local_710);
  local_78e = andres::Iterator<int,true,std::allocator<unsigned_long>>::operator==
                        ((Iterator<int,true,std::allocator<unsigned_long>> *)local_758,&local_7c0);
  test(&local_78e);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::~Iterator(&local_7c0);
  pIVar7 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator--
                     ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_758);
  piVar6 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator*(pIVar7);
  shape_7.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._7_1_ = *piVar6 == 0x17;
  test((bool *)((long)&shape_7.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::~Iterator
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_758);
  andres::View<int,_true,_std::allocator<unsigned_long>_>::~View
            ((View<int,_true,_std::allocator<unsigned_long>_> *)local_710);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_6c8);
  puVar2 = &v_7.geometry_.field_0x37;
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)puVar2);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_7e0,3,
             (allocator_type *)puVar2);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)&v_7.geometry_.field_0x37);
  pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_7e0,0);
  *pvVar3 = 3;
  pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_7e0,1);
  *pvVar3 = 4;
  pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_7e0,2);
  *pvVar3 = 2;
  iVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_7e0);
  iVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_7e0);
  paVar1 = (allocator<int> *)
           ((long)&it_7.current.coordinates_.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<int>::allocator(paVar1);
  andres::View<int,true,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,true,std::allocator<unsigned_long>> *)local_828,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar4._M_current,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar5._M_current,this->data_,&andres::defaultOrder,&andres::defaultOrder,paVar1);
  std::allocator<int>::~allocator
            ((allocator<int> *)
             ((long)&it_7.current.coordinates_.
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  std::reverse_iterator<andres::Iterator<int,_true,_std::allocator<unsigned_long>_>_>::
  reverse_iterator((reverse_iterator<andres::Iterator<int,_true,_std::allocator<unsigned_long>_>_> *
                   )local_870);
  andres::View<int,_true,_std::allocator<unsigned_long>_>::rbegin
            ((reverse_iterator *)local_8a0,
             (View<int,_true,_std::allocator<unsigned_long>_> *)local_828);
  std::reverse_iterator<andres::Iterator<int,_true,_std::allocator<unsigned_long>_>_>::operator=
            ((reverse_iterator<andres::Iterator<int,_true,_std::allocator<unsigned_long>_>_> *)
             local_870,
             (reverse_iterator<andres::Iterator<int,_true,_std::allocator<unsigned_long>_>_> *)
             local_8a0);
  std::reverse_iterator<andres::Iterator<int,_true,_std::allocator<unsigned_long>_>_>::
  ~reverse_iterator((reverse_iterator<andres::Iterator<int,_true,_std::allocator<unsigned_long>_>_>
                     *)local_8a0);
  for (local_8a4 = 0x17; -1 < local_8a4; local_8a4 = local_8a4 + -1) {
    piVar8 = std::reverse_iterator<andres::Iterator<int,_true,_std::allocator<unsigned_long>_>_>::
             operator*((reverse_iterator<andres::Iterator<int,_true,_std::allocator<unsigned_long>_>_>
                        *)local_870);
    local_8a5 = *piVar8 == this->data_[local_8a4];
    test(&local_8a5);
    std::reverse_iterator<andres::Iterator<int,_true,_std::allocator<unsigned_long>_>_>::operator++
              ((reverse_iterator<andres::Iterator<int,_true,_std::allocator<unsigned_long>_>_> *)
               local_870);
  }
  andres::View<int,_true,_std::allocator<unsigned_long>_>::rend
            (&local_8d8,(View<int,_true,_std::allocator<unsigned_long>_> *)local_828);
  local_8a6 = std::operator==((reverse_iterator<andres::Iterator<int,_true,_std::allocator<unsigned_long>_>_>
                               *)local_870,&local_8d8);
  test(&local_8a6);
  std::reverse_iterator<andres::Iterator<int,_true,_std::allocator<unsigned_long>_>_>::
  ~reverse_iterator(&local_8d8);
  prVar9 = std::reverse_iterator<andres::Iterator<int,_true,_std::allocator<unsigned_long>_>_>::
           operator--((reverse_iterator<andres::Iterator<int,_true,_std::allocator<unsigned_long>_>_>
                       *)local_870);
  piVar8 = std::reverse_iterator<andres::Iterator<int,_true,_std::allocator<unsigned_long>_>_>::
           operator*(prVar9);
  shape_8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._7_1_ = *piVar8 == 0;
  test((bool *)((long)&shape_8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  std::reverse_iterator<andres::Iterator<int,_true,_std::allocator<unsigned_long>_>_>::
  ~reverse_iterator((reverse_iterator<andres::Iterator<int,_true,_std::allocator<unsigned_long>_>_>
                     *)local_870);
  andres::View<int,_true,_std::allocator<unsigned_long>_>::~View
            ((View<int,_true,_std::allocator<unsigned_long>_> *)local_828);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_7e0);
  puVar2 = &v_8.geometry_.field_0x37;
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)puVar2);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_8f8,3,
             (allocator_type *)puVar2);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)&v_8.geometry_.field_0x37);
  pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_8f8,0);
  *pvVar3 = 3;
  pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_8f8,1);
  *pvVar3 = 4;
  pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_8f8,2);
  *pvVar3 = 2;
  iVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_8f8);
  iVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_8f8);
  paVar1 = (allocator<int> *)
           ((long)&it_8.coordinates_.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<int>::allocator(paVar1);
  andres::View<int,true,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,true,std::allocator<unsigned_long>> *)local_940,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar4._M_current,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar5._M_current,this->data_,&andres::defaultOrder,&andres::defaultOrder,paVar1);
  std::allocator<int>::~allocator
            ((allocator<int> *)
             ((long)&it_8.coordinates_.
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_988);
  andres::View<int,_true,_std::allocator<unsigned_long>_>::begin
            ((iterator *)local_9b8,(View<int,_true,_std::allocator<unsigned_long>_> *)local_940);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator=
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_988,
             (Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_9b8);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::~Iterator
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_9b8);
  for (local_9bc = 0; local_9bc < 0x18; local_9bc = local_9bc + 1) {
    piVar6 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator*
                       ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_988);
    local_9bd = *piVar6 == this->data_[local_9bc];
    test(&local_9bd);
    andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator++
              ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_988);
  }
  andres::View<int,_true,_std::allocator<unsigned_long>_>::end
            (&local_9f0,(View<int,_true,_std::allocator<unsigned_long>_> *)local_940);
  local_9be = andres::Iterator<int,true,std::allocator<unsigned_long>>::operator==
                        ((Iterator<int,true,std::allocator<unsigned_long>> *)local_988,&local_9f0);
  test(&local_9be);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::~Iterator(&local_9f0);
  pIVar7 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator--
                     ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_988);
  piVar6 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator*(pIVar7);
  local_9f1 = *piVar6 == 0x17;
  test(&local_9f1);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::~Iterator
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_988);
  andres::View<int,_true,_std::allocator<unsigned_long>_>::~View
            ((View<int,_true,_std::allocator<unsigned_long>_> *)local_940);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_8f8);
  return;
}

Assistant:

void ViewTest::iteratorAccessTest(){
    // 1D
    {
        {
            std::vector<std::size_t> shape(1);
            shape[0] = 24;
            andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);
            typename andres::View<int, constTarget>::iterator it;
            it = v.begin();
            for(int i = 0; i < 24; ++i){
                test(*it == data_[i]);
                ++it;
            }
            test(it == v.end());
            test(*(--it)==23);
        }
        // reverse
        {
            std::vector<std::size_t> shape(1);
            shape[0] = 24;
            andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);
            typename andres::View<int, constTarget>::reverse_iterator it;
            it = v.rbegin();
            for(int i = 23; i >= 0; --i){
                test(*it == data_[i]);
                ++it;
            }
            test(it == v.rend());
            test(*(--it)==0);
        }
        // const
        {
            std::vector<std::size_t> shape(1);
            shape[0] = 24;
            andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);
            typename andres::View<int, constTarget>::const_iterator it;
            it = v.begin();
            for(int i = 0; i < 24; ++i){
                test(*it == data_[i]);
                ++it;
            }
            test(it == v.end());
            test(*(--it)==23);
        }
    }
    // 2D
    {
        {
            std::vector<std::size_t> shape(2);
            shape[0] = 6;
            shape[1] = 4;
            andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);
            typename andres::View<int, constTarget>::iterator it;
            it = v.begin();
            for(int i = 0; i < 24; ++i){
                test(*it == data_[i]);
                ++it;
            }
            test(it == v.end());
            test(*(--it)==23);
        }
        // reverse
        {
            std::vector<std::size_t> shape(2);
            shape[0] = 6;
            shape[1] = 4; 
            andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);
            typename andres::View<int, constTarget>::reverse_iterator it;
            it = v.rbegin();
            for(int i = 23; i >= 0; --i){
                test(*it == data_[i]);
                ++it;
            }
            test(it == v.rend());
            test(*(--it)==0);
        }
        // const
        {
            std::vector<std::size_t> shape(2);
            shape[0] = 6;
            shape[1] = 4;
            andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);
            typename andres::View<int, constTarget>::const_iterator it;
            it = v.begin();
            for(int i = 0; i < 24; ++i){
                test(*it == data_[i]);
                ++it;
            }
            test(it == v.end());
            test(*(--it)==23);
        }
    }
    // 3D
    {
        {
            std::vector<std::size_t> shape(3);
            shape[0] = 3;
            shape[1] = 4;
            shape[2] = 2;
            andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);
            typename andres::View<int, constTarget>::iterator it;
            it = v.begin();
            for(int i = 0; i < 24; ++i){
                test(*it == data_[i]);
                ++it;
            }
            test(it == v.end());
            test(*(--it)==23);
        }
        // reverse
        {
            std::vector<std::size_t> shape(3);
            shape[0] = 3;
            shape[1] = 4;
            shape[2] = 2;
            andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);
            typename andres::View<int, constTarget>::reverse_iterator it;
            it = v.rbegin();
            for(int i = 23; i >= 0; --i){
                test(*it == data_[i]);
                ++it;
            }
            test(it == v.rend());
            test(*(--it)==0);
        }
        // cosnt
        {
            std::vector<std::size_t> shape(3);
            shape[0] = 3;
            shape[1] = 4;
            shape[2] = 2;
            andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);
            typename andres::View<int, constTarget>::const_iterator it;
            it = v.begin();
            for(int i = 0; i < 24; ++i){
                test(*it == data_[i]);
                ++it;
            }
            test(it == v.end());
            test(*(--it)==23);
        }
    }
}